

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

bool f8n::env::CopyFile(string *from,string *to)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  streambuf *psVar4;
  ostream local_438 [8];
  ofstream out;
  undefined1 local_228 [8];
  ifstream in;
  string *to_local;
  string *from_local;
  
  lVar3 = std::__cxx11::string::size();
  if (((lVar3 != 0) && (lVar3 = std::__cxx11::string::size(), lVar3 != 0)) &&
     (bVar1 = std::operator!=(from,to), bVar1)) {
    std::ifstream::ifstream(local_228,from,8);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
LAB_002c2e97:
      bVar1 = false;
    }
    else {
      std::ofstream::ofstream(local_438,to,0x10);
      bVar2 = std::ofstream::is_open();
      bVar1 = (bVar2 & 1) != 0;
      if (bVar1) {
        psVar4 = (streambuf *)std::ifstream::rdbuf();
        std::ostream::operator<<(local_438,psVar4);
        from_local._7_1_ = 1;
      }
      std::ofstream::~ofstream(local_438);
      if (!bVar1) goto LAB_002c2e97;
    }
    std::ifstream::~ifstream(local_228);
    if (bVar1) goto LAB_002c2ecf;
  }
  from_local._7_1_ = 0;
LAB_002c2ecf:
  return (bool)(from_local._7_1_ & 1);
}

Assistant:

bool CopyFile(const std::string& from, const std::string& to) {
        if (from.size() && to.size() && from != to) {
            std::ifstream in(from);
            if (in.is_open()) {
                std::ofstream out(to);
                if (out.is_open()) {
                    out << in.rdbuf();
                    return true;
                }
            }
        }
        return false;
    }